

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree_FastGen.hpp
# Opt level: O0

int __thiscall
Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::GenMatcher::Binder::bind
          (Binder *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  bool bVar1;
  ulong extraout_RAX;
  undefined7 extraout_var;
  ulong uVar2;
  TermList *aux;
  TermList *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  TermList local_10;
  bool local_1;
  
  uVar2 = (ulong)(uint)__fd;
  if (this->_maxVar < (uint)__fd) {
    local_1 = false;
  }
  else {
    local_10._content = (uint64_t)__addr;
    bVar1 = Lib::ArrayMap<Kernel::TermList>::getValuePtr
                      ((ArrayMap<Kernel::TermList> *)CONCAT44(__fd,in_stack_ffffffffffffffe0),
                       (size_t)in_stack_ffffffffffffffd8,(TermList **)__addr,(TermList)this);
    if (bVar1) {
      Lib::Stack<unsigned_int>::push((Stack<unsigned_int> *)__addr,(uint)((ulong)this >> 0x20));
      local_1 = true;
      uVar2 = extraout_RAX;
    }
    else {
      local_1 = Kernel::TermList::operator==(in_stack_ffffffffffffffd8,&local_10);
      uVar2 = CONCAT71(extraout_var,local_1);
    }
  }
  return (int)CONCAT71((int7)(uVar2 >> 8),local_1);
}

Assistant:

bool bind(unsigned var, TermList term)
  {
    if(var > _maxVar) {
      return false;
    }
    TermList* aux;
    if(_parent->_bindings.getValuePtr(var,aux,term)) {
      _parent->_boundVars.push(var);
      return true;
    } else {
      return *aux==term;
    }
  }